

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_32.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_diag_sse2_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int32_t imm;
  uint uVar11;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int imm_00;
  int imm_01;
  undefined4 in_register_0000008c;
  longlong lVar13;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  longlong extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  __m128i vWH_00;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i alVar14;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i mask;
  __m128i mask_00;
  __m128i mask_01;
  __m128i mask_02;
  __m128i mask_03;
  __m128i mask_04;
  __m128i mask_05;
  __m128i mask_06;
  int32_t in_stack_fffffffffffff568;
  uint local_a8c;
  int local_a78;
  int local_a74;
  int local_a60;
  int local_a5c;
  int local_a48;
  int local_a44;
  int local_a30;
  int local_a2c;
  int local_9ec;
  int local_9e8;
  int local_9e4;
  longlong *plStack_9e0;
  int32_t k;
  int32_t *j_1;
  int32_t *i_1;
  int32_t *u;
  int32_t *t;
  int32_t *s;
  int local_9b0;
  int32_t last_val;
  int32_t max_col;
  int32_t max_row;
  __m128i cond_all_col;
  __m128i cond_all_row;
  __m128i cond_last_val;
  __m128i cond_max_col;
  __m128i cond_max_row;
  __m128i cond_i;
  __m128i cond_j;
  __m128i vJltLimit;
  __m128i vJgtNegOne;
  __m128i vJeqLimit1;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  __m128i vIeqLimit1;
  __m128i vIltLimit;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vEndJ;
  __m128i vEndI;
  __m128i vLastVal;
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int32_t score;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int32_t *F_pr;
  int32_t *H_pr;
  int32_t *s2;
  int32_t *_F_pr;
  int32_t *_H_pr;
  int32_t *s2B;
  int32_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  longlong lVar12;
  
  lVar13 = CONCAT44(in_register_0000008c,gap);
  s2B = (int32_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_sse2_128_32","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_diag_sse2_128_32","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_diag_sse2_128_32","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_diag_sse2_128_32","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_sse2_128_32","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_sse2_128_32","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_diag_sse2_128_32","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_9e8 = _s1Len;
    if (matrix->type != 0) {
      local_9e8 = matrix->length;
    }
    NEG_LIMIT = 0;
    POS_LIMIT = 0;
    if (-open < matrix->min) {
      local_9ec = open + -0x80000000;
    }
    else {
      local_9ec = -0x80000000 - matrix->min;
    }
    local_9ec = local_9ec + 1;
    iVar10 = 0x7ffffffe - matrix->max;
    vNegInf[1] = CONCAT44(local_9ec,local_9ec);
    vSaturationCheckMax[0] = CONCAT44(local_9ec,local_9ec);
    vSaturationCheckMax[1] = CONCAT44(iVar10,iVar10);
    vSaturationCheckMin[0] = CONCAT44(iVar10,iVar10);
    vILimit[1] = CONCAT44(local_9ec,local_9ec);
    vEndJ[0] = CONCAT44(local_9ec,local_9ec);
    vILimit[0] = CONCAT44(local_9e8,local_9e8);
    vEndJ[1] = vILimit[1];
    vEndI[0] = vEndJ[0];
    vEndI[1] = vILimit[1];
    vLastVal[0] = vEndJ[0];
    vLastVal[1] = vILimit[1];
    vMaxHCol[0] = vEndJ[0];
    vMaxHCol[1] = vILimit[1];
    _s1_local = (char *)parasail_result_new_table1(local_9e8,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x4401002;
      uVar11 = 0;
      if (s1_beg != 0) {
        uVar11 = 8;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar11 | ((parasail_result_t *)_s1_local)->flag;
      uVar11 = 0;
      if (s1_end != 0) {
        uVar11 = 0x10;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar11 | ((parasail_result_t *)_s1_local)->flag;
      uVar11 = 0;
      if (s2_beg != 0) {
        uVar11 = 0x4000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar11 | ((parasail_result_t *)_s1_local)->flag;
      uVar11 = 0;
      if (s2_end != 0) {
        uVar11 = 0x8000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar11 | ((parasail_result_t *)_s1_local)->flag;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x20000;
      ptr = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_00 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_01 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      if (ptr == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2B = parasail_memalign_int32_t(0x10,(long)(local_9e8 + 3));
          if (s2B == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (end_query = 0; end_query < local_9e8; end_query = end_query + 1) {
            s2B[end_query] = matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_9e8; end_query < local_9e8 + 3; end_query = end_query + 1) {
            s2B[end_query] = 0;
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 3] = matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -3; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 3] = 0;
        }
        while (end_ref = iVar1, end_ref < s2Len + 3) {
          ptr[(long)end_ref + 3] = 0;
          iVar1 = end_ref + 1;
        }
        if (s2_beg == 0) {
          for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
            ptr_00[(long)end_ref + 3] = -(end_ref * gap) - open;
            ptr_01[(long)end_ref + 3] = local_9ec;
          }
        }
        else {
          for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
            ptr_00[(long)end_ref + 3] = 0;
            ptr_01[(long)end_ref + 3] = local_9ec;
          }
        }
        for (end_ref = -3; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 3] = local_9ec;
          ptr_01[(long)end_ref + 3] = local_9ec;
        }
        while (end_ref = iVar1, end_ref < s2Len + 3) {
          ptr_00[(long)end_ref + 3] = local_9ec;
          ptr_01[(long)end_ref + 3] = local_9ec;
          iVar1 = end_ref + 1;
        }
        ptr_00[2] = 0;
        for (end_query = 0; end_query < local_9e8; end_query = end_query + 4) {
          piVar4 = matrix->matrix;
          iVar1 = matrix->size;
          if (matrix->type == 0) {
            local_a2c = s2B[end_query];
          }
          else {
            if (end_query < local_9e8) {
              local_a30 = end_query;
            }
            else {
              local_a30 = local_9e8 + -1;
            }
            local_a2c = local_a30;
          }
          piVar5 = matrix->matrix;
          iVar2 = matrix->size;
          if (matrix->type == 0) {
            local_a44 = s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_9e8) {
              local_a48 = end_query + 1;
            }
            else {
              local_a48 = local_9e8 + -1;
            }
            local_a44 = local_a48;
          }
          piVar6 = matrix->matrix;
          iVar3 = matrix->size;
          if (matrix->type == 0) {
            local_a5c = s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_9e8) {
              local_a60 = end_query + 2;
            }
            else {
              local_a60 = local_9e8 + -1;
            }
            local_a5c = local_a60;
          }
          if (matrix->type == 0) {
            local_a74 = s2B[end_query + 3];
          }
          else {
            if (end_query + 3 < local_9e8) {
              local_a78 = end_query + 3;
            }
            else {
              local_a78 = local_9e8 + -1;
            }
            local_a74 = local_a78;
          }
          imm_00 = matrix->size * local_a74;
          alVar14[0] = (ulong)(uint)ptr_00[2];
          alVar14[1] = 3;
          alVar14 = _mm_insert_epi32_rpl(alVar14,local_a74,imm_00);
          if (s1_beg == 0) {
            imm_00 = end_query * gap;
            local_a8c = -imm_00 - open;
          }
          else {
            local_a8c = 0;
          }
          a[0] = (ulong)local_a8c;
          a[1] = 3;
          alVar14 = _mm_insert_epi32_rpl(a,(int32_t)alVar14[1],imm_00);
          lVar12 = alVar14[1];
          ptr_00[2] = -((end_query + 4) * gap) - open;
          for (end_ref = 0; end_ref < s2Len + 3; end_ref = end_ref + 1) {
            a_00[0] = (ulong)(uint)ptr_00[(long)end_ref + 3];
            a_00[1] = 3;
            alVar14 = _mm_insert_epi32_rpl(a_00,(int32_t)lVar12,end_ref);
            a_04[0] = (long)end_ref;
            a_01[0] = (ulong)(uint)ptr_01[a_04[0] + 3];
            a_01[1]._0_4_ = 3;
            a_01[1]._4_4_ = 0;
            lVar12 = 3;
            alVar14 = _mm_insert_epi32_rpl(a_01,(int32_t)alVar14[1],end_ref);
            b[0] = alVar14[1];
            a_02[1] = lVar12;
            a_02[0] = a_01[0];
            b[1] = a_04[0];
            alVar14 = _mm_max_epi32_rpl(a_02,b);
            b_00[0] = alVar14[1];
            a_03[1] = lVar12;
            a_03[0] = a_01[0];
            b_00[1] = a_04[0];
            _mm_max_epi32_rpl(a_03,b_00);
            b_01[0] = (ulong)(uint)piVar5[(long)(iVar2 * local_a44) +
                                          (long)ptr[(long)(end_ref + -1) + 3]];
            b_08[1] = (long)(end_ref + -3);
            a_04[0] = (long)ptr[b_08[1] + 3];
            a_04[1]._0_4_ = piVar4[(long)(iVar1 * local_a2c) + (long)ptr[(long)end_ref + 3]];
            a_04[1]._4_4_ = 0;
            vWH_00[0] = (ulong)(uint)piVar4[(long)(iVar1 * local_a2c) + (long)ptr[(long)end_ref + 3]
                                           ];
            b_01[1]._0_4_ = piVar6[(long)(iVar3 * local_a5c) + (long)ptr[(long)(end_ref + -2) + 3]];
            b_01[1]._4_4_ = 0;
            a_01[0] = (ulong)(uint)piVar6[(long)(iVar3 * local_a5c) +
                                          (long)ptr[(long)(end_ref + -2) + 3]];
            alVar14 = _mm_max_epi32_rpl(a_04,b_01);
            b_02[0] = alVar14[1];
            a_05[1] = vWH_00[0];
            a_05[0] = a_04[0];
            b_02[1] = a_01[0];
            alVar14 = _mm_max_epi32_rpl(a_05,b_02);
            b_03[0] = alVar14[1];
            a_06[1] = vWH_00[0];
            a_06[0] = a_04[0];
            b_03[1] = a_01[0];
            mask[1] = lVar13;
            mask[0] = b_08[1];
            alVar14 = _mm_blendv_epi8_rpl(a_06,b_03,mask);
            b_04[0] = alVar14[1];
            a_07[1] = vWH_00[0];
            a_07[0] = a_04[0];
            b_04[1] = a_01[0];
            mask_00[1] = lVar13;
            mask_00[0] = b_08[1];
            alVar14 = _mm_blendv_epi8_rpl(a_07,b_04,mask_00);
            b_05[0] = alVar14[1];
            a_08[1] = vWH_00[0];
            a_08[0] = a_04[0];
            b_05[1] = a_01[0];
            mask_01[1] = lVar13;
            mask_01[0] = b_08[1];
            alVar14 = _mm_blendv_epi8_rpl(a_08,b_05,mask_01);
            b_06[0] = alVar14[1];
            if (3 < end_ref) {
              a_09[1] = vWH_00[0];
              a_09[0] = a_04[0];
              b_06[1] = a_01[0];
              alVar14 = _mm_min_epi32_rpl(a_09,b_06);
              b_07[0] = alVar14[1];
              a_10[1] = vWH_00[0];
              a_10[0] = a_04[0];
              b_07[1] = a_01[0];
              _mm_max_epi32_rpl(a_10,b_07);
              vNegInf[1] = extraout_XMM0_Qa_00;
              vSaturationCheckMax[0] = extraout_XMM0_Qb_00;
              vSaturationCheckMax[1] = extraout_XMM0_Qa;
              vSaturationCheckMin[0] = extraout_XMM0_Qb;
            }
            vWH_00[0] = (ulong)(uint)end_query;
            a_01[0] = (ulong)(uint)s2Len;
            vWH_00[1]._0_4_ = local_9e8;
            vWH_00[1]._4_4_ = 0;
            arr_store_si128(((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row,vWH_00,
                            end_ref,s2Len,(int32_t)lVar13,in_stack_fffffffffffff568);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = vWH_00[0];
            imm = _mm_extract_epi32_rpl((__m128i)(auVar7 << 0x40),imm_01);
            lVar12 = 0;
            ptr_00[(long)(end_ref + -3) + 3] = imm;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = vWH_00[0];
            uVar11 = _mm_extract_epi32_rpl((__m128i)(auVar9 << 0x40),imm);
            b_08[0] = (ulong)uVar11;
            b_08[1] = (long)(end_ref + -3);
            ptr_01[b_08[1] + 3] = uVar11;
            a_11[1] = vWH_00[0];
            a_11[0] = lVar12;
            mask_02[1] = lVar13;
            mask_02[0] = a_01[0];
            alVar14 = _mm_blendv_epi8_rpl(a_11,b_08,mask_02);
            b_09[0] = alVar14[1];
            a_12[1] = vWH_00[0];
            a_12[0] = lVar12;
            b_09[1] = b_08[1];
            mask_03[1] = lVar13;
            mask_03[0] = a_01[0];
            vMaxHCol[1] = extraout_XMM0_Qa_01;
            alVar14 = _mm_blendv_epi8_rpl(a_12,b_09,mask_03);
            b_10[0] = alVar14[1];
            a_13[1] = vWH_00[0];
            a_13[0] = lVar12;
            b_10[1] = b_08[1];
            mask_04[1] = lVar13;
            mask_04[0] = a_01[0];
            vLastVal[1] = extraout_XMM0_Qa_02;
            vMaxHCol[0] = extraout_XMM0_Qb_01;
            alVar14 = _mm_blendv_epi8_rpl(a_13,b_10,mask_04);
            b_11[0] = alVar14[1];
            a_14[1] = vWH_00[0];
            a_14[0] = lVar12;
            b_11[1] = b_08[1];
            mask_05[1] = lVar13;
            mask_05[0] = a_01[0];
            vEndI[1] = extraout_XMM0_Qa_03;
            vLastVal[0] = extraout_XMM0_Qb_02;
            alVar14 = _mm_blendv_epi8_rpl(a_14,b_11,mask_05);
            b_12[0] = alVar14[1];
            a_15[1] = vWH_00[0];
            a_15[0] = lVar12;
            b_12[1] = b_08[1];
            mask_06[1] = lVar13;
            mask_06[0] = a_01[0];
            vEndJ[1] = extraout_XMM0_Qa_04;
            vEndI[0] = extraout_XMM0_Qb_03;
            alVar14 = _mm_blendv_epi8_rpl(a_15,b_12,mask_06);
            lVar12 = alVar14[1];
            vILimit[1] = extraout_XMM0_Qa_05;
            vEndJ[0] = extraout_XMM0_Qb_04;
          }
        }
        t = (int32_t *)(vMaxHCol + 1);
        u = (int32_t *)(vLastVal + 1);
        i_1 = (int32_t *)(vEndI + 1);
        j_1 = (int32_t *)(vEndJ + 1);
        plStack_9e0 = vILimit + 1;
        s._4_4_ = local_9ec;
        local_9b0 = local_9ec;
        last_val = local_9ec;
        for (local_9e4 = 0; local_9e4 < 4; local_9e4 = local_9e4 + 1) {
          if ((local_9b0 < *u) || ((*u == local_9b0 && (*j_1 < NEG_LIMIT)))) {
            local_9b0 = *u;
            NEG_LIMIT = *j_1;
          }
          if (last_val < *t) {
            last_val = *t;
            POS_LIMIT = (int32_t)*plStack_9e0;
          }
          if (s._4_4_ < *i_1) {
            s._4_4_ = *i_1;
          }
          t = t + 1;
          u = u + 1;
          i_1 = i_1 + 1;
          j_1 = j_1 + 1;
          plStack_9e0 = (longlong *)((long)plStack_9e0 + 4);
        }
        if ((s1_end == 0) || (s2_end == 0)) {
          if (s1_end == 0) {
            if (s2_end == 0) {
              vNegLimit[1]._4_4_ = s._4_4_;
              POS_LIMIT = s2Len + -1;
            }
            else {
              vNegLimit[1]._4_4_ = last_val;
            }
            NEG_LIMIT = local_9e8 + -1;
          }
          else {
            vNegLimit[1]._4_4_ = local_9b0;
            POS_LIMIT = s2Len + -1;
          }
        }
        else if ((last_val < local_9b0) || ((local_9b0 == last_val && (POS_LIMIT == s2Len + -1)))) {
          vNegLimit[1]._4_4_ = local_9b0;
          POS_LIMIT = s2Len + -1;
        }
        else {
          vNegLimit[1]._4_4_ = last_val;
          NEG_LIMIT = local_9e8 + -1;
        }
        local_198 = (int)vSaturationCheckMax[1];
        iStack_194 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_190 = (int)vSaturationCheckMin[0];
        iStack_18c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_168 = (int)vNegInf[1];
        iStack_164 = (int)((ulong)vNegInf[1] >> 0x20);
        iStack_160 = (int)vSaturationCheckMax[0];
        iStack_15c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        a_01[0] = CONCAT44(-(uint)(iStack_18c < local_9ec),-(uint)(iStack_190 < local_9ec)) |
                  CONCAT44(-(uint)(iVar10 < iStack_15c),-(uint)(iVar10 < iStack_160));
        auVar8._8_8_ = a_01[0];
        auVar8._0_8_ = CONCAT44(-(uint)(iStack_194 < local_9ec),-(uint)(local_198 < local_9ec)) |
                       CONCAT44(-(uint)(iVar10 < iStack_164),-(uint)(iVar10 < local_168));
        if ((((((((((((((((auVar8 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar8 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar8 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar8 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar8 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar8 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (a_01[0] >> 7 & 1) != 0) || (a_01[0] >> 0xf & 1) != 0) ||
                (a_01[0] >> 0x17 & 1) != 0) || (a_01[0] >> 0x1f & 1) != 0) ||
              (a_01[0] >> 0x27 & 1) != 0) || (a_01[0] >> 0x2f & 1) != 0) ||
            (a_01[0] >> 0x37 & 1) != 0) || (long)a_01[0] < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          vNegLimit[1]._4_4_ = 0;
          NEG_LIMIT = 0;
          POS_LIMIT = 0;
        }
        ((parasail_result_t *)_s1_local)->score = vNegLimit[1]._4_4_;
        ((parasail_result_t *)_s1_local)->end_query = NEG_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = POS_LIMIT;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32_rpl(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32_rpl(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, F_pr[j], 3);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32_rpl(vNWH, vE);
            vWH = _mm_max_epi32_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}